

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O1

bool dxil_spv::emit_ray_query_commit_procedural_primitive_instruction
               (Impl *impl,CallInst *instruction)

{
  bool bVar1;
  uint in_EAX;
  Id arg;
  Value *pVVar2;
  Operation *this;
  Id ray_object_id;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,pVVar2,(Id *)((long)&uStack_28 + 4),(uint32_t *)0x0);
  if (bVar1) {
    this = Converter::Impl::allocate(impl,OpRayQueryGenerateIntersectionKHR);
    Operation::add_id(this,uStack_28._4_4_);
    pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    arg = Converter::Impl::get_id_for_value(impl,pVVar2,0);
    Operation::add_id(this,arg);
    Converter::Impl::add(impl,this,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_commit_procedural_primitive_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryGenerateIntersectionKHR);
	op->add_id(ray_object_id);
	op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
	impl.add(op);
	return true;
}